

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *
vkt::pipeline::anon_unknown_0::generateVertices
          (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
           *__return_storage_ptr__,GeometryType geometryType)

{
  long lVar1;
  allocator_type local_b1;
  _Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_b0;
  Vertex4RGBA local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  Vertex4RGBA local_58;
  undefined1 *local_38;
  float afStack_30 [6];
  
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(geometryType) {
  case GEOMETRY_TYPE_OPAQUE_TRIANGLE:
  case GEOMETRY_TYPE_INVISIBLE_TRIANGLE:
    local_98.position.m_data[0] = -0.75;
    local_98.position.m_data[1] = 0.0;
    local_98.position.m_data[2] = 0.0;
    local_98.position.m_data[3] = 1.0;
    local_98.color.m_data[0] = 1.0;
    local_98.color.m_data[1] = 0.0;
    local_98.color.m_data[2] = 0.0;
    local_98.color.m_data[3] = 1.0;
    local_78 = 0x3e0000003f400000;
    uStack_70 = 0x3f80000000000000;
    local_68 = 0x3f800000;
    uStack_60 = 0x3f80000000000000;
    local_58.position.m_data[0] = 0.75;
    local_58.position.m_data[1] = -0.125;
    local_58.position.m_data[2] = 0.0;
    local_58.position.m_data[3] = 1.0;
    local_58.color.m_data[0] = 1.0;
    local_58.color.m_data[1] = 0.0;
    local_58.color.m_data[2] = 0.0;
    local_58.color.m_data[3] = 1.0;
    if (geometryType == GEOMETRY_TYPE_INVISIBLE_TRIANGLE) {
      for (lVar1 = 0x10; lVar1 != 0x70; lVar1 = lVar1 + 0x20) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_b0);
        *(pointer *)((long)local_98.position.m_data + lVar1) =
             local_b0._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)((long)local_98.position.m_data + lVar1 + 8) =
             local_b0._M_impl.super__Vector_impl_data._M_finish;
      }
    }
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<vkt::pipeline::Vertex4RGBA*,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_b0,&local_98,(Vertex4RGBA *)&local_38,&local_b1);
    break;
  case GEOMETRY_TYPE_OPAQUE_LINE:
    local_98.position.m_data[0] = -0.75;
    local_98.position.m_data[1] = 0.25;
    local_98.position.m_data[2] = 0.0;
    local_98.position.m_data[3] = 1.0;
    local_98.color.m_data[0] = 1.0;
    local_98.color.m_data[1] = 0.0;
    local_98.color.m_data[2] = 0.0;
    local_98.color.m_data[3] = 1.0;
    local_78 = 0xbe8000003f400000;
    uStack_70 = 0x3f80000000000000;
    local_68 = 0x3f800000;
    uStack_60 = 0x3f80000000000000;
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<vkt::pipeline::Vertex4RGBA_const*,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_b0,&local_98,&local_58,&local_b1);
    break;
  case GEOMETRY_TYPE_OPAQUE_POINT:
    local_98.position.m_data[0] = 0.0;
    local_98.position.m_data[1] = 0.0;
    local_98.position.m_data[2] = 0.0;
    local_98.position.m_data[3] = 1.0;
    local_98.color.m_data[0] = 1.0;
    local_98.color.m_data[1] = 0.0;
    local_98.color.m_data[2] = 0.0;
    local_98.color.m_data[3] = 1.0;
    std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
              ((vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &local_b0,1,&local_98,&local_b1);
    break;
  case GEOMETRY_TYPE_OPAQUE_QUAD:
  case GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH:
  case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
  case GEOMETRY_TYPE_INVISIBLE_QUAD:
  case GEOMETRY_TYPE_GRADIENT_QUAD:
    local_98.position.m_data[0] = -1.0;
    local_98.position.m_data[1] = -1.0;
    local_98.position.m_data[2] = 0.0;
    local_98.position.m_data[3] = 1.0;
    local_98.color.m_data[0] = 1.0;
    local_98.color.m_data[1] = 0.0;
    local_98.color.m_data[2] = 0.0;
    local_98.color.m_data[3] = 1.0;
    local_78 = 0xbf8000003f800000;
    uStack_70 = 0x3f80000000000000;
    local_68 = 0x3f800000;
    uStack_60 = 0x3f80000000000000;
    local_58.position.m_data[0] = -1.0;
    local_58.position.m_data[1] = 1.0;
    local_58.position.m_data[2] = 0.0;
    local_58.position.m_data[3] = 1.0;
    local_58.color.m_data[0] = 1.0;
    local_58.color.m_data[1] = 0.0;
    local_58.color.m_data[2] = 0.0;
    local_58.color.m_data[3] = 1.0;
    local_38 = &DAT_3f8000003f800000;
    afStack_30[0] = 0.0;
    afStack_30[1] = 1.0;
    afStack_30[2] = 1.0;
    afStack_30[3] = 0.0;
    afStack_30[4] = 0.0;
    afStack_30[5] = 1.0;
    switch(geometryType) {
    case GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH:
      for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
        *(undefined4 *)((long)local_98.position.m_data + lVar1 + 8) = 0x3f000000;
      }
      break;
    case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
      for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
        *(undefined4 *)((long)local_98.color.m_data + lVar1 + 0xc) = 0x3e800000;
      }
      break;
    case GEOMETRY_TYPE_INVISIBLE_QUAD:
      for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
        *(undefined4 *)((long)local_98.color.m_data + lVar1 + 0xc) = 0;
      }
      break;
    case GEOMETRY_TYPE_GRADIENT_QUAD:
      local_98.color.m_data[2] = 0.0;
      local_98.color.m_data[3] = 0.0;
      local_58.color.m_data[2] = 0.0;
      local_58.color.m_data[3] = 0.0;
    }
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<vkt::pipeline::Vertex4RGBA*,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &local_b0,&local_98,(Vertex4RGBA *)&stack0xffffffffffffffe8,&local_b1);
    break;
  default:
    goto switchD_004ed0bd_default;
  }
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  _M_move_assign(__return_storage_ptr__,&local_b0);
  std::_Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::
  ~_Vector_base(&local_b0);
switchD_004ed0bd_default:
  return __return_storage_ptr__;
}

Assistant:

std::vector<Vertex4RGBA> generateVertices (const GeometryType geometryType)
{
	std::vector<Vertex4RGBA> vertices;

	switch (geometryType)
	{
		case GEOMETRY_TYPE_OPAQUE_TRIANGLE:
		case GEOMETRY_TYPE_INVISIBLE_TRIANGLE:
		{
			Vertex4RGBA vertexData[3] =
			{
				{
					tcu::Vec4(-0.75f, 0.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(0.75f, 0.125f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(0.75f, -0.125f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				}
			};

			if (geometryType == GEOMETRY_TYPE_INVISIBLE_TRIANGLE)
			{
				for (int i = 0; i < 3; i++)
					vertexData[i].color = tcu::Vec4();
			}

			vertices = std::vector<Vertex4RGBA>(vertexData, vertexData + 3);
			break;
		}

		case GEOMETRY_TYPE_OPAQUE_LINE:
		{
			const Vertex4RGBA vertexData[2] =
			{
				{
					tcu::Vec4(-0.75f, 0.25f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(0.75f, -0.25f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				}
			};

			vertices = std::vector<Vertex4RGBA>(vertexData, vertexData + 2);
			break;
		}

		case GEOMETRY_TYPE_OPAQUE_POINT:
		{
			const Vertex4RGBA vertex =
			{
				tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
				tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
			};

			vertices = std::vector<Vertex4RGBA>(1, vertex);
			break;
		}

		case GEOMETRY_TYPE_OPAQUE_QUAD:
		case GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH:
		case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
		case GEOMETRY_TYPE_INVISIBLE_QUAD:
		case GEOMETRY_TYPE_GRADIENT_QUAD:
		{
			Vertex4RGBA vertexData[4] =
			{
				{
					tcu::Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(1.0f, -1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(-1.0f, 1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				},
				{
					tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f),
					tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f)
				}
			};

			if (geometryType == GEOMETRY_TYPE_TRANSLUCENT_QUAD)
			{
				for (int i = 0; i < 4; i++)
					vertexData[i].color.w() = 0.25f;
			}
			else if (geometryType == GEOMETRY_TYPE_INVISIBLE_QUAD)
			{
				for (int i = 0; i < 4; i++)
					vertexData[i].color.w() = 0.0f;
			}
			else if (geometryType == GEOMETRY_TYPE_GRADIENT_QUAD)
			{
				vertexData[0].color.w() = 0.0f;
				vertexData[2].color.w() = 0.0f;
			}
			else if (geometryType == GEOMETRY_TYPE_OPAQUE_QUAD_NONZERO_DEPTH)
			{
				for (int i = 0; i < 4; i++)
					vertexData[i].position.z() = 0.5f;
			}

			vertices = std::vector<Vertex4RGBA>(vertexData, vertexData + 4);
			break;
		}

		default:
			DE_ASSERT(false);
	}
	return vertices;
}